

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O1

void YAML::QueueUnicodeCodepoint(deque<char,_std::allocator<char>_> *q,unsigned_long ch)

{
  iterator *piVar1;
  _Elt_pointer pcVar2;
  byte *pbVar3;
  byte bVar4;
  ulong uVar5;
  byte local_1a;
  byte local_19;
  byte local_18;
  byte local_17;
  byte local_16;
  byte local_15;
  byte local_14;
  byte local_13;
  byte local_12;
  byte local_11;
  
  uVar5 = 0xfffd;
  if (ch != 4) {
    uVar5 = ch;
  }
  bVar4 = (byte)uVar5;
  if (uVar5 < 0x80) {
    pcVar2 = (q->super__Deque_base<char,_std::allocator<char>_>)._M_impl.super__Deque_impl_data.
             _M_finish._M_cur;
    if (pcVar2 != (q->super__Deque_base<char,_std::allocator<char>_>)._M_impl.super__Deque_impl_data
                  ._M_finish._M_last + -1) goto LAB_00729c62;
    pbVar3 = &local_11;
    local_11 = bVar4;
  }
  else if (uVar5 < 0x800) {
    local_12 = (byte)(uVar5 >> 6) | 0xc0;
    pbVar3 = (byte *)(q->super__Deque_base<char,_std::allocator<char>_>)._M_impl.
                     super__Deque_impl_data._M_finish._M_cur;
    if (pbVar3 == (byte *)((q->super__Deque_base<char,_std::allocator<char>_>)._M_impl.
                           super__Deque_impl_data._M_finish._M_last + -1)) {
      std::deque<char,_std::allocator<char>_>::_M_push_back_aux<char>(q,(char *)&local_12);
    }
    else {
      *pbVar3 = local_12;
      piVar1 = &(q->super__Deque_base<char,_std::allocator<char>_>)._M_impl.super__Deque_impl_data.
                _M_finish;
      piVar1->_M_cur = piVar1->_M_cur + 1;
    }
    local_13 = bVar4 & 0x3f | 0x80;
    uVar5 = (ulong)local_13;
    pcVar2 = (q->super__Deque_base<char,_std::allocator<char>_>)._M_impl.super__Deque_impl_data.
             _M_finish._M_cur;
    if (pcVar2 != (q->super__Deque_base<char,_std::allocator<char>_>)._M_impl.super__Deque_impl_data
                  ._M_finish._M_last + -1) goto LAB_00729c62;
    pbVar3 = &local_13;
  }
  else if (uVar5 < 0x10000) {
    local_14 = (byte)((uint)uVar5 >> 0xc) | 0xe0;
    pbVar3 = (byte *)(q->super__Deque_base<char,_std::allocator<char>_>)._M_impl.
                     super__Deque_impl_data._M_finish._M_cur;
    if (pbVar3 == (byte *)((q->super__Deque_base<char,_std::allocator<char>_>)._M_impl.
                           super__Deque_impl_data._M_finish._M_last + -1)) {
      std::deque<char,_std::allocator<char>_>::_M_push_back_aux<char>(q,(char *)&local_14);
    }
    else {
      *pbVar3 = local_14;
      piVar1 = &(q->super__Deque_base<char,_std::allocator<char>_>)._M_impl.super__Deque_impl_data.
                _M_finish;
      piVar1->_M_cur = piVar1->_M_cur + 1;
    }
    local_15 = (byte)(uVar5 >> 6) & 0x3f | 0x80;
    pbVar3 = (byte *)(q->super__Deque_base<char,_std::allocator<char>_>)._M_impl.
                     super__Deque_impl_data._M_finish._M_cur;
    if (pbVar3 == (byte *)((q->super__Deque_base<char,_std::allocator<char>_>)._M_impl.
                           super__Deque_impl_data._M_finish._M_last + -1)) {
      std::deque<char,_std::allocator<char>_>::_M_push_back_aux<char>(q,(char *)&local_15);
    }
    else {
      *pbVar3 = local_15;
      piVar1 = &(q->super__Deque_base<char,_std::allocator<char>_>)._M_impl.super__Deque_impl_data.
                _M_finish;
      piVar1->_M_cur = piVar1->_M_cur + 1;
    }
    local_16 = bVar4 & 0x3f | 0x80;
    uVar5 = (ulong)local_16;
    pcVar2 = (q->super__Deque_base<char,_std::allocator<char>_>)._M_impl.super__Deque_impl_data.
             _M_finish._M_cur;
    if (pcVar2 != (q->super__Deque_base<char,_std::allocator<char>_>)._M_impl.super__Deque_impl_data
                  ._M_finish._M_last + -1) {
LAB_00729c62:
      *pcVar2 = (char)uVar5;
      piVar1 = &(q->super__Deque_base<char,_std::allocator<char>_>)._M_impl.super__Deque_impl_data.
                _M_finish;
      piVar1->_M_cur = piVar1->_M_cur + 1;
      return;
    }
    pbVar3 = &local_16;
  }
  else {
    local_17 = (byte)((uint)uVar5 >> 0x12) & 7 | 0xf0;
    pbVar3 = (byte *)(q->super__Deque_base<char,_std::allocator<char>_>)._M_impl.
                     super__Deque_impl_data._M_finish._M_cur;
    if (pbVar3 == (byte *)((q->super__Deque_base<char,_std::allocator<char>_>)._M_impl.
                           super__Deque_impl_data._M_finish._M_last + -1)) {
      std::deque<char,_std::allocator<char>_>::_M_push_back_aux<char>(q,(char *)&local_17);
    }
    else {
      *pbVar3 = local_17;
      piVar1 = &(q->super__Deque_base<char,_std::allocator<char>_>)._M_impl.super__Deque_impl_data.
                _M_finish;
      piVar1->_M_cur = piVar1->_M_cur + 1;
    }
    local_18 = (byte)(uVar5 >> 0xc) & 0x3f | 0x80;
    pbVar3 = (byte *)(q->super__Deque_base<char,_std::allocator<char>_>)._M_impl.
                     super__Deque_impl_data._M_finish._M_cur;
    if (pbVar3 == (byte *)((q->super__Deque_base<char,_std::allocator<char>_>)._M_impl.
                           super__Deque_impl_data._M_finish._M_last + -1)) {
      std::deque<char,_std::allocator<char>_>::_M_push_back_aux<char>(q,(char *)&local_18);
    }
    else {
      *pbVar3 = local_18;
      piVar1 = &(q->super__Deque_base<char,_std::allocator<char>_>)._M_impl.super__Deque_impl_data.
                _M_finish;
      piVar1->_M_cur = piVar1->_M_cur + 1;
    }
    local_19 = (byte)(uVar5 >> 6) & 0x3f | 0x80;
    pbVar3 = (byte *)(q->super__Deque_base<char,_std::allocator<char>_>)._M_impl.
                     super__Deque_impl_data._M_finish._M_cur;
    if (pbVar3 == (byte *)((q->super__Deque_base<char,_std::allocator<char>_>)._M_impl.
                           super__Deque_impl_data._M_finish._M_last + -1)) {
      std::deque<char,_std::allocator<char>_>::_M_push_back_aux<char>(q,(char *)&local_19);
    }
    else {
      *pbVar3 = local_19;
      piVar1 = &(q->super__Deque_base<char,_std::allocator<char>_>)._M_impl.super__Deque_impl_data.
                _M_finish;
      piVar1->_M_cur = piVar1->_M_cur + 1;
    }
    local_1a = bVar4 & 0x3f | 0x80;
    uVar5 = (ulong)local_1a;
    pcVar2 = (q->super__Deque_base<char,_std::allocator<char>_>)._M_impl.super__Deque_impl_data.
             _M_finish._M_cur;
    if (pcVar2 != (q->super__Deque_base<char,_std::allocator<char>_>)._M_impl.super__Deque_impl_data
                  ._M_finish._M_last + -1) goto LAB_00729c62;
    pbVar3 = &local_1a;
  }
  std::deque<char,_std::allocator<char>_>::_M_push_back_aux<char>(q,(char *)pbVar3);
  return;
}

Assistant:

inline void QueueUnicodeCodepoint(std::deque<char>& q, unsigned long ch) {
  // We are not allowed to queue the Stream::eof() codepoint, so
  // replace it with CP_REPLACEMENT_CHARACTER
  if (static_cast<unsigned long>(Stream::eof()) == ch) {
    ch = CP_REPLACEMENT_CHARACTER;
  }

  if (ch < 0x80) {
    q.push_back(Utf8Adjust(ch, 0, 0));
  } else if (ch < 0x800) {
    q.push_back(Utf8Adjust(ch, 2, 6));
    q.push_back(Utf8Adjust(ch, 1, 0));
  } else if (ch < 0x10000) {
    q.push_back(Utf8Adjust(ch, 3, 12));
    q.push_back(Utf8Adjust(ch, 1, 6));
    q.push_back(Utf8Adjust(ch, 1, 0));
  } else {
    q.push_back(Utf8Adjust(ch, 4, 18));
    q.push_back(Utf8Adjust(ch, 1, 12));
    q.push_back(Utf8Adjust(ch, 1, 6));
    q.push_back(Utf8Adjust(ch, 1, 0));
  }
}